

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.h
# Opt level: O0

void __thiscall Ptex::v2_2::PtexTriangleKernel::reorient(PtexTriangleKernel *this,int eid,int aeid)

{
  int in_EDX;
  int in_ESI;
  PtexTriangleKernel *in_RDI;
  float fVar1;
  float w;
  
  fVar1 = (1.0 - in_RDI->u) - in_RDI->v;
  switch(in_ESI * 3 + in_EDX) {
  case 0:
    set(in_RDI,1.0 - in_RDI->u,-in_RDI->v,1.0 - in_RDI->u2,-in_RDI->v2,1.0 - in_RDI->w2,
        1.0 - in_RDI->u1,-in_RDI->v1,1.0 - in_RDI->w1);
    break;
  case 1:
    set(in_RDI,1.0 - fVar1,1.0 - in_RDI->u,1.0 - in_RDI->w2,1.0 - in_RDI->u2,-in_RDI->v2,
        1.0 - in_RDI->w1,1.0 - in_RDI->u1,-in_RDI->v1);
    rotate1((PtexTriangleKernel *)0x153f78);
    break;
  case 2:
    set(in_RDI,-in_RDI->v,1.0 - fVar1,-in_RDI->v2,1.0 - in_RDI->w2,1.0 - in_RDI->u2,-in_RDI->v1,
        1.0 - in_RDI->w1,1.0 - in_RDI->u1);
    rotate2((PtexTriangleKernel *)0x154007);
    break;
  case 3:
    set(in_RDI,1.0 - in_RDI->v,-fVar1,1.0 - in_RDI->v2,-in_RDI->w2,1.0 - in_RDI->u2,1.0 - in_RDI->v1
        ,-in_RDI->w1,1.0 - in_RDI->u1);
    rotate2((PtexTriangleKernel *)0x154096);
    break;
  case 4:
    set(in_RDI,1.0 - in_RDI->u,1.0 - in_RDI->v,1.0 - in_RDI->u2,1.0 - in_RDI->v2,-in_RDI->w2,
        1.0 - in_RDI->u1,1.0 - in_RDI->v1,-in_RDI->w1);
    break;
  case 5:
    set(in_RDI,-fVar1,1.0 - in_RDI->u,-in_RDI->w2,1.0 - in_RDI->u2,1.0 - in_RDI->v2,-in_RDI->w1,
        1.0 - in_RDI->u1,1.0 - in_RDI->v1);
    rotate1((PtexTriangleKernel *)0x1541a5);
    break;
  case 6:
    set(in_RDI,1.0 - fVar1,-in_RDI->u,1.0 - in_RDI->w2,-in_RDI->u2,1.0 - in_RDI->v2,1.0 - in_RDI->w1
        ,-in_RDI->u1,1.0 - in_RDI->v1);
    rotate1((PtexTriangleKernel *)0x154234);
    break;
  case 7:
    set(in_RDI,1.0 - in_RDI->v,1.0 - fVar1,1.0 - in_RDI->v2,1.0 - in_RDI->w2,-in_RDI->u2,
        1.0 - in_RDI->v1,1.0 - in_RDI->w1,-in_RDI->u1);
    rotate2((PtexTriangleKernel *)0x1542be);
    break;
  case 8:
    set(in_RDI,-in_RDI->u,1.0 - in_RDI->v,-in_RDI->u2,1.0 - in_RDI->v2,1.0 - in_RDI->w2,-in_RDI->u1,
        1.0 - in_RDI->v1,1.0 - in_RDI->w1);
  }
  return;
}

Assistant:

void reorient(int eid, int aeid)
    {
        float w = 1.0f-u-v;

#define C(eid, aeid) (eid*3 + aeid)
        switch (C(eid, aeid)) {
        case C(0, 0): set(1.0f-u, -v, 1.0f-u2, -v2, 1.0f-w2, 1.0f-u1, -v1, 1.0f-w1); break;
        case C(0, 1): set(1.0f-w, 1.0f-u, 1.0f-w2, 1.0f-u2, -v2, 1.0f-w1, 1.0f-u1, -v1); rotate1(); break;
        case C(0, 2): set( -v, 1.0f-w, -v2, 1.0f-w2, 1.0f-u2, -v1, 1.0f-w1, 1.0f-u1); rotate2(); break;

        case C(1, 0): set(1.0f-v, -w, 1.0f-v2, -w2, 1.0f-u2, 1.0f-v1, -w1, 1.0f-u1); rotate2(); break;
        case C(1, 1): set(1.0f-u, 1.0f-v, 1.0f-u2, 1.0f-v2, -w2, 1.0f-u1, 1.0f-v1, -w1); break;
        case C(1, 2): set( -w, 1.0f-u, -w2, 1.0f-u2, 1.0f-v2, -w1, 1.0f-u1, 1.0f-v1); rotate1(); break;

        case C(2, 0): set(1.0f-w, -u, 1.0f-w2, -u2, 1.0f-v2, 1.0f-w1, -u1, 1.0f-v1); rotate1(); break;
        case C(2, 1): set(1.0f-v, 1.0f-w, 1.0f-v2, 1.0f-w2, -u2, 1.0f-v1, 1.0f-w1, -u1); rotate2(); break;
        case C(2, 2): set( -u, 1.0f-v, -u2, 1.0f-v2, 1.0f-w2, -u1, 1.0f-v1, 1.0f-w1); break;
#undef C
        }
    }